

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
NodeView::get_long_reads(NodeView *this,string *datastore_name)

{
  bool bVar1;
  LongReadsDatastore *pLVar2;
  size_type *in_RSI;
  size_type __n;
  vector<long,_std::allocator<long>_> *in_RDI;
  unsigned_long rm;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  vector<long,_std::allocator<long>_> *reads;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  vector<long,_std::allocator<long>_> *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  string *in_stack_ffffffffffffffc8;
  WorkSpace *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x47cb5f);
  pLVar2 = WorkSpace::get_long_reads_datastore(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __n = *in_RSI;
  if ((long)__n < 1) {
    __n = -__n;
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[](&(pLVar2->mapper).reads_in_node,__n);
  local_40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)this_00,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(&local_40);
    std::vector<long,_std::allocator<long>_>::push_back
              (this_00,(value_type *)in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_40);
  }
  return in_RDI;
}

Assistant:

std::vector<seqID_t> NodeView::get_long_reads(std::string datastore_name) const {
    std::vector<seqID_t> reads;
    for(auto rm:dg->sdg.ws.get_long_reads_datastore(datastore_name).mapper.reads_in_node[llabs(id)]) reads.push_back(rm);
    return reads;
}